

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

int xmlValidateDtdFinal(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  _xmlDtd *p_Var1;
  int iVar2;
  
  iVar2 = 0;
  if ((ctxt != (xmlValidCtxtPtr)0x0 && doc != (xmlDocPtr)0x0) &&
     ((p_Var1 = doc->intSubset, p_Var1 != (_xmlDtd *)0x0 || (doc->extSubset != (_xmlDtd *)0x0)))) {
    ctxt->doc = doc;
    ctxt->valid = 1;
    if (p_Var1 != (_xmlDtd *)0x0) {
      if ((xmlHashTablePtr)p_Var1->attributes != (xmlHashTablePtr)0x0) {
        xmlHashScan((xmlHashTablePtr)p_Var1->attributes,xmlValidateAttributeCallback,ctxt);
      }
      if ((xmlHashTablePtr)p_Var1->entities != (xmlHashTablePtr)0x0) {
        xmlHashScan((xmlHashTablePtr)p_Var1->entities,xmlValidateNotationCallback,ctxt);
      }
    }
    p_Var1 = doc->extSubset;
    if (p_Var1 != (_xmlDtd *)0x0) {
      if ((xmlHashTablePtr)p_Var1->attributes != (xmlHashTablePtr)0x0) {
        xmlHashScan((xmlHashTablePtr)p_Var1->attributes,xmlValidateAttributeCallback,ctxt);
      }
      if ((xmlHashTablePtr)p_Var1->entities != (xmlHashTablePtr)0x0) {
        xmlHashScan((xmlHashTablePtr)p_Var1->entities,xmlValidateNotationCallback,ctxt);
      }
    }
    iVar2 = ctxt->valid;
  }
  return iVar2;
}

Assistant:

int
xmlValidateDtdFinal(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlDtdPtr dtd;
    xmlAttributeTablePtr table;
    xmlEntitiesTablePtr entities;

    if ((doc == NULL) || (ctxt == NULL)) return(0);
    if ((doc->intSubset == NULL) && (doc->extSubset == NULL))
	return(0);
    ctxt->doc = doc;
    ctxt->valid = 1;
    dtd = doc->intSubset;
    if ((dtd != NULL) && (dtd->attributes != NULL)) {
	table = (xmlAttributeTablePtr) dtd->attributes;
	xmlHashScan(table, xmlValidateAttributeCallback, ctxt);
    }
    if ((dtd != NULL) && (dtd->entities != NULL)) {
	entities = (xmlEntitiesTablePtr) dtd->entities;
	xmlHashScan(entities, xmlValidateNotationCallback, ctxt);
    }
    dtd = doc->extSubset;
    if ((dtd != NULL) && (dtd->attributes != NULL)) {
	table = (xmlAttributeTablePtr) dtd->attributes;
	xmlHashScan(table, xmlValidateAttributeCallback, ctxt);
    }
    if ((dtd != NULL) && (dtd->entities != NULL)) {
	entities = (xmlEntitiesTablePtr) dtd->entities;
	xmlHashScan(entities, xmlValidateNotationCallback, ctxt);
    }
    return(ctxt->valid);
}